

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

void prune_tx_2D(MACROBLOCK *x,BLOCK_SIZE bsize,TX_SIZE tx_size,int blk_row,int blk_col,
                TxSetType tx_set_type,TX_TYPE_PRUNE_MODE prune_2d_txfm_mode,int *txk_map,
                uint16_t *allowed_tx_mask)

{
  NN_CONFIG *pNVar1;
  _Bool _Var2;
  int in_ECX;
  long lVar3;
  byte in_DL;
  byte in_SIL;
  long *in_RDI;
  int in_R8D;
  char in_R9B;
  byte in_stack_00000008;
  void *in_stack_00000010;
  float inv_sum_score;
  int tx_count;
  int tx_idx_1;
  float score_ratio;
  float temp_score;
  int allow_tx_type;
  int tx_idx;
  float scores_2D [16];
  int tx_type_allowed [16];
  int allow_count;
  float sum_score;
  uint16_t allow_bitmask;
  float max_score;
  int max_score_i;
  float score_thresh;
  float *cur_scores_2D;
  int i;
  int16_t *diff;
  int diff_stride;
  macroblock_plane *p;
  int vfeatures_num;
  int hfeatures_num;
  int bh;
  int bw;
  float scores_2D_raw [16];
  float vscores [4];
  float hscores [4];
  float vfeatures [16];
  float hfeatures [16];
  NN_CONFIG *nn_config_ver;
  NN_CONFIG *nn_config_hor;
  float *in_stack_00000260;
  float *in_stack_00000268;
  int in_stack_00000274;
  int in_stack_00000278;
  int in_stack_0000027c;
  int16_t *in_stack_00000280;
  int32_t *in_stack_00000590;
  float *in_stack_00000598;
  int local_1fc;
  int local_1f8;
  int local_1f0;
  int local_1ec;
  float local_1e8;
  float local_1e4;
  int local_1dc;
  float local_1d8 [3];
  TX_TYPE_PRUNE_MODE in_stack_fffffffffffffe35;
  TxSetType in_stack_fffffffffffffe36;
  TX_SIZE in_stack_fffffffffffffe37;
  int local_198 [16];
  int local_158;
  float local_154;
  uint16_t local_14e;
  float local_14c;
  int local_148;
  float local_144;
  float *local_140;
  int local_134;
  int16_t *local_130;
  uint local_124;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  float local_108 [16];
  float local_c8 [4];
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  float local_a8 [16];
  float local_68 [14];
  int32_t *in_stack_ffffffffffffffd0;
  NN_CONFIG *k;
  
  if ((in_R9B == '\x05') || (in_R9B == '\x04')) {
    pNVar1 = av1_tx_type_nnconfig_map_hor[in_DL];
    k = av1_tx_type_nnconfig_map_ver[in_DL];
    if ((pNVar1 != (NN_CONFIG *)0x0) && (k != (NN_CONFIG *)0x0)) {
      local_10c = tx_size_wide[in_DL];
      local_110 = tx_size_high[in_DL];
      local_1f8 = local_10c;
      if (8 < local_10c) {
        local_1f8 = local_10c / 2;
      }
      local_114 = local_1f8;
      local_1fc = local_110;
      if (8 < local_110) {
        local_1fc = local_110 / 2;
      }
      local_118 = local_1fc;
      local_124 = (uint)block_size_wide[in_SIL];
      local_130 = (int16_t *)
                  (*in_RDI + (long)(int)(in_ECX * 4 * local_124) * 2 + (long)(in_R8D << 2) * 2);
      get_energy_distribution_finer
                (in_stack_00000280,in_stack_0000027c,in_stack_00000278,in_stack_00000274,
                 in_stack_00000268,in_stack_00000260);
      (*av1_get_horver_correlation_full)
                (local_130,local_124,local_10c,local_110,local_68 + (local_114 + -1),
                 local_a8 + (local_118 + -1));
      (*av1_nn_predict)(local_68,pNVar1,1,&local_b8);
      (*av1_nn_predict)(local_a8,k,1,local_c8);
      for (local_134 = 0; local_134 < 4; local_134 = local_134 + 1) {
        lVar3 = (long)(local_134 << 2);
        local_140 = local_108 + lVar3;
        local_108[lVar3] = local_c8[local_134] * local_b8;
        local_108[lVar3 + 1] = local_c8[local_134] * local_b4;
        local_108[lVar3 + 2] = local_c8[local_134] * local_b0;
        local_108[lVar3 + 3] = local_c8[local_134] * local_ac;
      }
      (*av1_nn_fast_softmax_16)(local_108,local_108);
      local_144 = get_adaptive_thresholds
                            (in_stack_fffffffffffffe37,in_stack_fffffffffffffe36,
                             in_stack_fffffffffffffe35);
      local_148 = 0;
      local_14c = 0.0;
      local_14e = 0;
      local_154 = 0.0;
      local_158 = 0;
      memcpy(local_198,&DAT_00baad80,0x40);
      memcpy(local_1d8,&DAT_00baadc0,0x40);
      for (local_1dc = 0; local_1dc < 0x10; local_1dc = local_1dc + 1) {
        _Var2 = check_bit_mask(*_tx_count,prune_tx_2D::tx_type_table_2D[local_1dc]);
        if (_Var2) {
          if (local_14c < local_108[local_1dc]) {
            local_14c = local_108[local_1dc];
            local_148 = local_1dc;
          }
          if (local_144 <= local_108[local_1dc]) {
            set_bit_mask(&local_14e,prune_tx_2D::tx_type_table_2D[local_1dc]);
            local_154 = local_108[local_1dc] + local_154;
            local_1d8[local_158] = local_108[local_1dc];
            local_198[local_158] = prune_tx_2D::tx_type_table_2D[local_1dc];
            local_158 = local_158 + 1;
          }
        }
      }
      _Var2 = check_bit_mask(local_14e,prune_tx_2D::tx_type_table_2D[local_148]);
      if (_Var2) {
        if (local_158 < 9) {
          av1_sort_fi32_8((float *)k,in_stack_ffffffffffffffd0);
        }
        else {
          av1_sort_fi32_16(in_stack_00000598,in_stack_00000590);
        }
        if (3 < in_stack_00000008) {
          local_1e4 = 0.0;
          local_1e8 = 0.0;
          local_1ec = 0;
          for (local_1f0 = 0; (local_1ec < local_158 && ((local_1e8 <= 30.0 || (local_1f0 < 2))));
              local_1f0 = local_1f0 + 1) {
            local_1e4 = local_1d8[local_1ec] + local_1e4;
            local_1e8 = local_1e4 * (100.0 / local_154);
            local_1ec = local_1ec + 1;
          }
          for (; local_1ec < local_158; local_1ec = local_1ec + 1) {
            unset_bit_mask(&local_14e,local_198[local_1ec]);
          }
        }
        memcpy(in_stack_00000010,local_198,0x40);
        *_tx_count = local_14e;
      }
      else {
        set_bit_mask(&local_14e,prune_tx_2D::tx_type_table_2D[local_148]);
        memcpy(in_stack_00000010,prune_tx_2D::tx_type_table_2D,0x40);
        *_tx_count = local_14e;
      }
    }
  }
  return;
}

Assistant:

static void prune_tx_2D(MACROBLOCK *x, BLOCK_SIZE bsize, TX_SIZE tx_size,
                        int blk_row, int blk_col, TxSetType tx_set_type,
                        TX_TYPE_PRUNE_MODE prune_2d_txfm_mode, int *txk_map,
                        uint16_t *allowed_tx_mask) {
  // This table is used because the search order is different from the enum
  // order.
  static const int tx_type_table_2D[16] = {
    DCT_DCT,      DCT_ADST,      DCT_FLIPADST,      V_DCT,
    ADST_DCT,     ADST_ADST,     ADST_FLIPADST,     V_ADST,
    FLIPADST_DCT, FLIPADST_ADST, FLIPADST_FLIPADST, V_FLIPADST,
    H_DCT,        H_ADST,        H_FLIPADST,        IDTX
  };
  if (tx_set_type != EXT_TX_SET_ALL16 &&
      tx_set_type != EXT_TX_SET_DTT9_IDTX_1DDCT)
    return;
#if CONFIG_NN_V2
  NN_CONFIG_V2 *nn_config_hor = av1_tx_type_nnconfig_map_hor[tx_size];
  NN_CONFIG_V2 *nn_config_ver = av1_tx_type_nnconfig_map_ver[tx_size];
#else
  const NN_CONFIG *nn_config_hor = av1_tx_type_nnconfig_map_hor[tx_size];
  const NN_CONFIG *nn_config_ver = av1_tx_type_nnconfig_map_ver[tx_size];
#endif
  if (!nn_config_hor || !nn_config_ver) return;  // Model not established yet.

  float hfeatures[16], vfeatures[16];
  float hscores[4], vscores[4];
  float scores_2D_raw[16];
  const int bw = tx_size_wide[tx_size];
  const int bh = tx_size_high[tx_size];
  const int hfeatures_num = bw <= 8 ? bw : bw / 2;
  const int vfeatures_num = bh <= 8 ? bh : bh / 2;
  assert(hfeatures_num <= 16);
  assert(vfeatures_num <= 16);

  const struct macroblock_plane *const p = &x->plane[0];
  const int diff_stride = block_size_wide[bsize];
  const int16_t *diff = p->src_diff + 4 * blk_row * diff_stride + 4 * blk_col;
  get_energy_distribution_finer(diff, diff_stride, bw, bh, hfeatures,
                                vfeatures);

  av1_get_horver_correlation_full(diff, diff_stride, bw, bh,
                                  &hfeatures[hfeatures_num - 1],
                                  &vfeatures[vfeatures_num - 1]);

#if CONFIG_NN_V2
  av1_nn_predict_v2(hfeatures, nn_config_hor, 0, hscores);
  av1_nn_predict_v2(vfeatures, nn_config_ver, 0, vscores);
#else
  av1_nn_predict(hfeatures, nn_config_hor, 1, hscores);
  av1_nn_predict(vfeatures, nn_config_ver, 1, vscores);
#endif

  for (int i = 0; i < 4; i++) {
    float *cur_scores_2D = scores_2D_raw + i * 4;
    cur_scores_2D[0] = vscores[i] * hscores[0];
    cur_scores_2D[1] = vscores[i] * hscores[1];
    cur_scores_2D[2] = vscores[i] * hscores[2];
    cur_scores_2D[3] = vscores[i] * hscores[3];
  }

  assert(TX_TYPES == 16);
  // This version of the function only works when there are at most 16 classes.
  // So we will need to change the optimization or use av1_nn_softmax instead if
  // this ever gets changed.
  av1_nn_fast_softmax_16(scores_2D_raw, scores_2D_raw);

  const float score_thresh =
      get_adaptive_thresholds(tx_size, tx_set_type, prune_2d_txfm_mode);

  // Always keep the TX type with the highest score, prune all others with
  // score below score_thresh.
  int max_score_i = 0;
  float max_score = 0.0f;
  uint16_t allow_bitmask = 0;
  float sum_score = 0.0;
  // Calculate sum of allowed tx type score and Populate allow bit mask based
  // on score_thresh and allowed_tx_mask
  int allow_count = 0;
  int tx_type_allowed[16] = { TX_TYPE_INVALID, TX_TYPE_INVALID, TX_TYPE_INVALID,
                              TX_TYPE_INVALID, TX_TYPE_INVALID, TX_TYPE_INVALID,
                              TX_TYPE_INVALID, TX_TYPE_INVALID, TX_TYPE_INVALID,
                              TX_TYPE_INVALID, TX_TYPE_INVALID, TX_TYPE_INVALID,
                              TX_TYPE_INVALID, TX_TYPE_INVALID, TX_TYPE_INVALID,
                              TX_TYPE_INVALID };
  float scores_2D[16] = {
    -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
  };
  for (int tx_idx = 0; tx_idx < TX_TYPES; tx_idx++) {
    const int allow_tx_type =
        check_bit_mask(*allowed_tx_mask, tx_type_table_2D[tx_idx]);
    if (!allow_tx_type) {
      continue;
    }
    if (scores_2D_raw[tx_idx] > max_score) {
      max_score = scores_2D_raw[tx_idx];
      max_score_i = tx_idx;
    }
    if (scores_2D_raw[tx_idx] >= score_thresh) {
      // Set allow mask based on score_thresh
      set_bit_mask(&allow_bitmask, tx_type_table_2D[tx_idx]);

      // Accumulate score of allowed tx type
      sum_score += scores_2D_raw[tx_idx];

      scores_2D[allow_count] = scores_2D_raw[tx_idx];
      tx_type_allowed[allow_count] = tx_type_table_2D[tx_idx];
      allow_count += 1;
    }
  }
  if (!check_bit_mask(allow_bitmask, tx_type_table_2D[max_score_i])) {
    // If even the tx_type with max score is pruned, this means that no other
    // tx_type is feasible. When this happens, we force enable max_score_i and
    // end the search.
    set_bit_mask(&allow_bitmask, tx_type_table_2D[max_score_i]);
    memcpy(txk_map, tx_type_table_2D, sizeof(tx_type_table_2D));
    *allowed_tx_mask = allow_bitmask;
    return;
  }

  // Sort tx type probability of all types
  if (allow_count <= 8) {
    av1_sort_fi32_8(scores_2D, tx_type_allowed);
  } else {
    av1_sort_fi32_16(scores_2D, tx_type_allowed);
  }

  // Enable more pruning based on tx type probability and number of allowed tx
  // types
  if (prune_2d_txfm_mode >= TX_TYPE_PRUNE_4) {
    float temp_score = 0.0;
    float score_ratio = 0.0;
    int tx_idx, tx_count = 0;
    const float inv_sum_score = 100 / sum_score;
    // Get allowed tx types based on sorted probability score and tx count
    for (tx_idx = 0; tx_idx < allow_count; tx_idx++) {
      // Skip the tx type which has more than 30% of cumulative
      // probability and allowed tx type count is more than 2
      if (score_ratio > 30.0 && tx_count >= 2) break;

      assert(check_bit_mask(allow_bitmask, tx_type_allowed[tx_idx]));
      // Calculate cumulative probability
      temp_score += scores_2D[tx_idx];

      // Calculate percentage of cumulative probability of allowed tx type
      score_ratio = temp_score * inv_sum_score;
      tx_count++;
    }
    // Set remaining tx types as pruned
    for (; tx_idx < allow_count; tx_idx++)
      unset_bit_mask(&allow_bitmask, tx_type_allowed[tx_idx]);
  }

  memcpy(txk_map, tx_type_allowed, sizeof(tx_type_table_2D));
  *allowed_tx_mask = allow_bitmask;
}